

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptHdrWrapper.cpp
# Opt level: O2

QString * OptHdrWrapper::translateSubsystem(DWORD subsystem)

{
  undefined4 in_EAX;
  mapped_type *pmVar1;
  iterator iVar2;
  QArrayDataPointer<char16_t> *other;
  key_type_conflict2 in_ESI;
  QArrayDataPointer<char16_t> *in_RDI;
  key_type_conflict2 local_28;
  key_type_conflict2 local_24;
  
  _local_28 = CONCAT44(in_ESI,in_EAX);
  if (s_subsystem._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    local_28 = 0;
    local_24 = in_ESI;
    pmVar1 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_subsystem,&local_28);
    QString::operator=(pmVar1,"Unknown subsystem");
    local_28 = 1;
    pmVar1 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_subsystem,&local_28);
    QString::operator=(pmVar1,"Driver");
    local_28 = 2;
    pmVar1 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_subsystem,&local_28);
    QString::operator=(pmVar1,"Windows GUI");
    local_28 = 3;
    pmVar1 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_subsystem,&local_28);
    QString::operator=(pmVar1,"Windows console");
    local_28 = 5;
    pmVar1 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_subsystem,&local_28);
    QString::operator=(pmVar1,"OS/2 console");
    local_28 = 7;
    pmVar1 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_subsystem,&local_28);
    QString::operator=(pmVar1,"Posix console");
    local_28 = 8;
    pmVar1 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_subsystem,&local_28);
    QString::operator=(pmVar1,"Native Win9x driver");
    local_28 = 9;
    pmVar1 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_subsystem,&local_28);
    QString::operator=(pmVar1,"Windows CE subsystem");
    local_28 = 10;
    pmVar1 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_subsystem,&local_28);
    QString::operator=(pmVar1,"EFI_APPLICATION");
    local_28 = 0xb;
    pmVar1 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_subsystem,&local_28);
    QString::operator=(pmVar1,"EFI_BOOT_SERVICE_DRIVER");
    local_28 = 0xc;
    pmVar1 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_subsystem,&local_28);
    QString::operator=(pmVar1,"EFI_RUNTIME_DRIVER");
    local_28 = 0xd;
    pmVar1 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_subsystem,&local_28);
    QString::operator=(pmVar1,"EFI_ROM");
    local_28 = 0xe;
    pmVar1 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_subsystem,&local_28);
    QString::operator=(pmVar1,"XBOX");
    _local_28 = CONCAT44(local_24,0x10);
    pmVar1 = std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_subsystem,&local_28);
    QString::operator=(pmVar1,"WINDOWS_BOOT_APPLICATION");
  }
  iVar2 = std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_QString>,_std::_Select1st<std::pair<const_unsigned_int,_QString>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
          ::find(&s_subsystem._M_t,&local_24);
  if ((_Rb_tree_header *)iVar2._M_node == &s_subsystem._M_t._M_impl.super__Rb_tree_header) {
    QString::QString((QString *)in_RDI,"");
  }
  else {
    other = &std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_subsystem,&local_24)->d;
    QArrayDataPointer<char16_t>::QArrayDataPointer(in_RDI,other);
  }
  return (QString *)in_RDI;
}

Assistant:

QString OptHdrWrapper::translateSubsystem(DWORD subsystem)
{
    if (s_subsystem.size() == 0) {
        s_subsystem[pe::SUB_UNKNOWN] = "Unknown subsystem";
        s_subsystem[pe::SUB_NATIVE] = "Driver";
        s_subsystem[pe::SUB_WINDOWS_GUI] = "Windows GUI";
        s_subsystem[pe::SUB_WINDOWS_CUI] = "Windows console";
        s_subsystem[pe::SUB_OS2_CUI] = "OS/2 console";
        s_subsystem[pe::SUB_POSIX_CUI] = "Posix console";
        s_subsystem[pe::SUB_NATIVE_WINDOWS] = "Native Win9x driver";
        s_subsystem[pe::SUB_WINDOWS_CE_GUI] = "Windows CE subsystem";
        s_subsystem[pe::SUB_EFI_APPLICATION] = "EFI_APPLICATION";
        s_subsystem[pe::SUB_EFI_BOOT_SERVICE_DRIVER] = "EFI_BOOT_SERVICE_DRIVER";
        s_subsystem[pe::SUB_EFI_RUNTIME_DRIVER] = "EFI_RUNTIME_DRIVER";
        s_subsystem[pe::SUB_EFI_ROM] = "EFI_ROM";
        s_subsystem[pe::SUB_XBOX] = "XBOX";
        s_subsystem[pe::SUB_WINDOWS_BOOT_APP] = "WINDOWS_BOOT_APPLICATION";
    }
    if (s_subsystem.find(subsystem) == s_subsystem.end()) return "";
    return s_subsystem[subsystem];
}